

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int remove_ext_list(nifti_image *nim,char **elist,int len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  void *__ptr;
  uint uVar7;
  char *__format;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar7 = nim->num_ext;
  if ((int)uVar7 < len) {
    fprintf(_stderr,"** cannot remove %d exts from image \'%s\' with only %d\n",(ulong)(uint)len,
            nim->fname,(ulong)uVar7);
  }
  else {
    if (len < 1) {
      __format = "** REL: (%d) no extensions to remove?\n";
      uVar8 = (ulong)(uint)len;
    }
    else {
      iVar5 = atoi(*elist);
      if (iVar5 == -1) {
        if (1 < g_debug) {
          fprintf(_stderr,"+d removing ALL (%d) extensions from \'%s\'\n",(ulong)uVar7,nim->fname);
        }
        nifti_free_extensions(nim);
        return 0;
      }
      if (2 < g_debug) {
        fprintf(_stderr,"+d removing %d exts from \'%s\'\n",(ulong)(uint)len,nim->fname);
        uVar7 = nim->num_ext;
      }
      __ptr = calloc((long)(int)uVar7,4);
      if (__ptr != (void *)0x0) {
        uVar8 = 0;
        while( true ) {
          if ((uint)len == uVar8) {
            uVar8 = (ulong)uVar7;
            do {
              lVar4 = uVar8 << 4;
              do {
                lVar9 = lVar4;
                uVar10 = uVar8;
                if ((int)uVar10 < 1) {
                  if (3 < g_debug) {
                    fwrite("-d done removing extensions\n",0x1c,1,_stderr);
                    uVar7 = nim->num_ext;
                  }
                  if (uVar7 == 0) {
                    if (1 < g_debug) {
                      fprintf(_stderr,"-d removed ALL extensions from %s\n",nim->fname);
                    }
                    free(nim->ext_list);
                    nim->ext_list = (nifti1_extension *)0x0;
                  }
                  free(__ptr);
                  return 0;
                }
                uVar8 = uVar10 - 1;
                lVar4 = lVar9 + -0x10;
              } while (*(int *)((long)__ptr + uVar10 * 4 + -4) == 0);
              if (2 < g_debug) {
                disp_nifti1_extension
                          ("+d removing ext: ",
                           (nifti1_extension *)((long)&nim->ext_list[-1].esize + lVar9),-1);
              }
              free(*(void **)((long)&nim->ext_list[-1].edata + lVar9));
              while( true ) {
                if (nim->num_ext <= (int)uVar10) break;
                puVar1 = (undefined8 *)((long)&nim->ext_list->esize + lVar9);
                uVar3 = puVar1[1];
                puVar2 = (undefined8 *)((long)&nim->ext_list[-1].esize + lVar9);
                *puVar2 = *puVar1;
                puVar2[1] = uVar3;
                lVar9 = lVar9 + 0x10;
                uVar10 = (ulong)((int)uVar10 + 1);
              }
              uVar7 = nim->num_ext - 1;
              nim->num_ext = uVar7;
            } while( true );
          }
          uVar6 = atoi(elist[uVar8]);
          if (((int)uVar6 < 0) || ((int)uVar7 <= (int)uVar6)) break;
          if (*(int *)((long)__ptr + (ulong)uVar6 * 4) != 0) {
            fprintf(_stderr,"** ext #%d (= %d) is a duplicate",uVar8 & 0xffffffff,(ulong)uVar6);
            goto LAB_0010aa76;
          }
          *(undefined4 *)((long)__ptr + (ulong)uVar6 * 4) = 1;
          uVar8 = uVar8 + 1;
        }
        fprintf(_stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",uVar8 & 0xffffffff,
                (ulong)uVar6,(ulong)(uVar7 - 1),nim->fname);
LAB_0010aa76:
        free(__ptr);
        return -1;
      }
      __format = "** failed to alloc %d marks\n";
      uVar8 = (ulong)uVar7;
    }
    fprintf(_stderr,__format,uVar8);
  }
  return -1;
}

Assistant:

int remove_ext_list( nifti_image * nim, char ** elist, int len )
{
   int * marks;
   int   c, ec, extval;

   if( len > nim->num_ext ){
      fprintf(stderr, "** cannot remove %d exts from image '%s' with only %d\n",
              len, nim->fname, nim->num_ext);
      return -1;
   }

   if( len <= 0 ){
      fprintf(stderr,"** REL: (%d) no extensions to remove?\n",len);
      return -1;
   }

   extval = atoi(elist[0]);  /* check the first value */

   /* first special case, elist[0] == -1 */
   if( extval == -1 )
   {
      if( g_debug > 1 )
          fprintf(stderr,"+d removing ALL (%d) extensions from '%s'\n",
                  nim->num_ext, nim->fname );
      nifti_free_extensions(nim);
      return 0;
   }

   if( g_debug > 2 )
      fprintf(stderr,"+d removing %d exts from '%s'\n", len, nim->fname );

   if( ! (marks = (int *)calloc(nim->num_ext, sizeof(int))) ) {
      fprintf(stderr,"** failed to alloc %d marks\n",nim->num_ext);
      return -1;
   }

   /* mark all extensions for removal */
   for( ec = 0; ec < len; ec++ )
   {
      extval = atoi(elist[ec]);

      if( extval < 0 || extval >= nim->num_ext ){
         fprintf(stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",
                 ec, extval, nim->num_ext-1, nim->fname);
         free(marks); return -1;
      }

      if( marks[extval] ){
         fprintf(stderr,"** ext #%d (= %d) is a duplicate", ec, extval);
         free(marks); return -1;
      }

      marks[extval]++;
   }

   /* now remove them - count from top down to do lazy programming */
   for( ec = nim->num_ext-1; ec >= 0; ec-- )
   {
      if( !marks[ec] ) continue;   /* do not delete this one */

      if( g_debug > 2 )
         disp_nifti1_extension("+d removing ext: ",nim->ext_list+ec,-1);

      /* delete this data, and shift the list down (yeah, inefficient) */
      if( nim->ext_list[ec].edata ) free( nim->ext_list[ec].edata );

      /* move anything above down one */
      for( c = ec+1; c < nim->num_ext; c++ )
         nim->ext_list[c-1] = nim->ext_list[c];

      nim->num_ext--;
   }

   if( g_debug > 3 ) fprintf(stderr,"-d done removing extensions\n");

   if( nim->num_ext == 0 ){  /* did we trash the only extension? */
      if( g_debug > 1 )
         fprintf(stderr,"-d removed ALL extensions from %s\n",nim->fname);
      free(nim->ext_list);
      nim->ext_list = NULL;
   }

   free(marks);
   return 0;
}